

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMControlDependenceAnalysisImpl.h
# Opt level: O3

void __thiscall
dg::LLVMControlDependenceAnalysisImpl::LLVMControlDependenceAnalysisImpl
          (LLVMControlDependenceAnalysisImpl *this,Module *module,
          LLVMControlDependenceAnalysisOptions *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->_vptr_LLVMControlDependenceAnalysisImpl =
       (_func_int **)&PTR__LLVMControlDependenceAnalysisImpl_0011fb58;
  this->_module = module;
  paVar1 = &(this->_options).super_LLVMAnalysisOptions.entryFunction.field_2;
  (this->_options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p;
  paVar2 = &(opts->super_LLVMAnalysisOptions).entryFunction.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(opts->super_LLVMAnalysisOptions).entryFunction.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_options).super_LLVMAnalysisOptions.entryFunction.field_2 + 8) =
         uVar4;
  }
  else {
    (this->_options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = pcVar3;
    (this->_options).super_LLVMAnalysisOptions.entryFunction.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->_options).super_LLVMAnalysisOptions.entryFunction._M_string_length =
       (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length;
  (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p = (pointer)paVar2;
  (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length = 0;
  (opts->super_LLVMAnalysisOptions).entryFunction.field_2._M_local_buf[0] = '\0';
  (this->_options).super_ControlDependenceAnalysisOptions.super_AnalysisOptions.fieldSensitivity.
  offset = (opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.fieldSensitivity.
           offset;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->_options).super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t._M_impl.super__Rb_tree_header,
             &(opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.
              allocationFunctions._M_t._M_impl.super__Rb_tree_header);
  (this->_options).super_ControlDependenceAnalysisOptions.interprocedural =
       (opts->super_ControlDependenceAnalysisOptions).interprocedural;
  (this->_options).super_ControlDependenceAnalysisOptions.algorithm =
       (opts->super_ControlDependenceAnalysisOptions).algorithm;
  *(undefined2 *)&(this->_options).super_ControlDependenceAnalysisOptions.field_0x3d =
       *(undefined2 *)&(opts->super_ControlDependenceAnalysisOptions).field_0x3d;
  return;
}

Assistant:

LLVMControlDependenceAnalysisImpl(const llvm::Module *module,
                                      LLVMControlDependenceAnalysisOptions opts)
            : _module(module), _options(std::move(opts)) {}